

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer(TPZTransfer<std::complex<float>_> *this)

{
  long lVar1;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZTransfer_0182cf30;
  *(undefined4 *)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c = 0;
  (this->fRowBlock).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZBlock_01870490;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0182ec58;
  lVar1 = 0x54;
  do {
    *(undefined ***)((long)(this->fRowBlock).fBlock.fExtAlloc + lVar1 + -0x54) =
         &PTR__TNode_01870578;
    *(undefined8 *)((long)(this->fRowBlock).fBlock.fExtAlloc + lVar1 + -0x4c) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xf4);
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (this->fRowBlock).fBlock.fExtAlloc
  ;
  (this->fRowBlock).fpMatrix = (TPZBaseMatrix *)0x0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements = 0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  (this->fColBlock).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZBlock_01870490;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0182ec58;
  lVar1 = 0;
  do {
    *(undefined ***)
     ((long)&(this->fColBlock).fBlock.fExtAlloc[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TNode_01870578;
    *(undefined8 *)((long)&(this->fColBlock).fBlock.fExtAlloc[0].pos + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xa0);
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (this->fColBlock).fBlock.fExtAlloc
  ;
  (this->fColBlock).fpMatrix = (TPZBaseMatrix *)0x0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements = 0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  TPZVec<int>::TPZVec(&this->fColPosition,0);
  TPZVec<int>::TPZVec(&this->fNumberofColumnBlocks,0);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockPosition,0);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockNumber,0);
  this->fColumnBlockLastUsed = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a928;
  (this->fDoubleValues).fExtAlloc[0]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[1]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[2]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[3]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[4]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[5]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[6]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[7]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[8]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[9]._M_value = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore = (this->fDoubleValues).fExtAlloc;
  this->fDoubleValLastUsed = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  return;
}

Assistant:

TPZTransfer<TVar>::TPZTransfer() : TPZRegisterClassId(&TPZTransfer::ClassId),
fNTVarVar(0),fRowBlock(),fColBlock(),fColPosition(0),fNumberofColumnBlocks(0),fColumnBlockPosition(0),
fColumnBlockNumber(0),fColumnBlockLastUsed(0),fDoubleValues(0),fDoubleValLastUsed(0) {
}